

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralComparators.hpp
# Opt level: O0

void __thiscall Kernel::LiteralComparators::ColoredFirst::~ColoredFirst(ColoredFirst *this)

{
  void *in_RDI;
  
  ~ColoredFirst((ColoredFirst *)0x895148);
  ::operator_delete(in_RDI,0x10);
  return;
}

Assistant:

Comparison compare(Literal* l1, Literal* l2)
  {
    if(l1->color()!=COLOR_TRANSPARENT && l2->color()==COLOR_TRANSPARENT) {
      return GREATER;
    } else if(l1->color()==COLOR_TRANSPARENT && l2->color()!=COLOR_TRANSPARENT) {
      return LESS;
    } else {
      return EQUAL;
    }
  }